

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpiabi_defn_functions_c.h
# Opt level: O0

int MPIABI_Win_create(void *base,MPIABI_Aint size,int disp_unit,MPIABI_Info info,MPIABI_Comm comm,
                     MPIABI_Win *win)

{
  int iVar1;
  ompi_info_t *poVar2;
  ompi_communicator_t *poVar3;
  ompi_win_t **ppoVar4;
  WPI_HandlePtr<ompi_win_t_*> local_50;
  WPI_Handle local_48 [8];
  WPI_Handle local_40 [8];
  MPIABI_Win *local_38;
  MPIABI_Win *win_local;
  MPIABI_Comm comm_local;
  MPIABI_Info info_local;
  MPIABI_Aint MStack_18;
  int disp_unit_local;
  MPIABI_Aint size_local;
  void *base_local;
  
  local_38 = win;
  win_local = (MPIABI_Win *)comm;
  comm_local = info;
  info_local._4_4_ = disp_unit;
  MStack_18 = size;
  size_local = (MPIABI_Aint)base;
  WPI_Handle<ompi_info_t_*>::WPI_Handle((WPI_Handle<ompi_info_t_*> *)local_40,info);
  poVar2 = WPI_Handle::operator_cast_to_ompi_info_t_(local_40);
  WPI_Handle<ompi_communicator_t_*>::WPI_Handle
            ((WPI_Handle<ompi_communicator_t_*> *)local_48,(uintptr_t)win_local);
  poVar3 = WPI_Handle::operator_cast_to_ompi_communicator_t_(local_48);
  WPI_HandlePtr<ompi_win_t_*>::WPI_HandlePtr(&local_50,local_38);
  ppoVar4 = WPI_HandlePtr::operator_cast_to_ompi_win_t__((WPI_HandlePtr *)&local_50);
  iVar1 = MPI_Win_create(base,size,disp_unit,poVar2,poVar3,ppoVar4);
  WPI_HandlePtr<ompi_win_t_*>::~WPI_HandlePtr(&local_50);
  return iVar1;
}

Assistant:

int MPIABI_Win_create(
  void * base,
  MPIABI_Aint size,
  int disp_unit,
  MPIABI_Info info,
  MPIABI_Comm comm,
  MPIABI_Win * win
) {
  return MPI_Win_create(
    base,
    (MPI_Aint)(WPI_Aint)size,
    disp_unit,
    (MPI_Info)(WPI_Info)info,
    (MPI_Comm)(WPI_Comm)comm,
    (MPI_Win *)(WPI_WinPtr)win
  );
}